

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txout_txoutreference.cpp
# Opt level: O2

void __thiscall
TxOutReference_Constractor_Test::TxOutReference_Constractor_Test
          (TxOutReference_Constractor_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005c4ca0;
  return;
}

Assistant:

TEST(TxOutReference, Constractor) {
  {
    int64_t satoshi = 1000000;
    TxOut txout(Amount::CreateBySatoshiAmount(satoshi), exp_script);
    TxOutReference txout_ref(txout);

    EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), satoshi);
    EXPECT_EQ(txout_ref.GetLockingScript().IsEmpty(), false);
    EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
                 exp_script.GetHex().c_str());
  }
}